

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printAssociativeContainer<QMap<QString,QVariant>>
                 (QDebug *debug,char *which,QMap<QString,_QVariant> *c)

{
  bool bVar1;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  const_iterator *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  Stream *this;
  QDebug in_stack_ffffffffffffffd8;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffd8.stream);
  QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffd8.stream);
  QMap<QString,_QVariant>::constBegin
            ((QMap<QString,_QVariant> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  while( true ) {
    QMap<QString,_QVariant>::constEnd
              ((QMap<QString,_QVariant> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    bVar1 = ::operator!=(in_stack_ffffffffffffff90,
                         (const_iterator *)
                         CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    if (!bVar1) break;
    in_stack_ffffffffffffff90 =
         (const_iterator *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
    QMap<QString,_QVariant>::const_iterator::key((const_iterator *)0xaed068);
    QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 =
         (QString *)QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffd8.stream);
    QMap<QString,_QVariant>::const_iterator::value((const_iterator *)0xaed093);
    ::operator<<((QDebug *)this,(QVariant *)in_RDI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
    QMap<QString,_QVariant>::const_iterator::operator++(in_stack_ffffffffffffff90);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  QDebug::QDebug((QDebug *)in_stack_ffffffffffffff90,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}